

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_slice.c
# Opt level: O3

MPP_RET h264e_marking_init(H264eMarkingInfo *marking)

{
  marking->idr_flag = 0;
  marking->no_output_of_prior_pics = 0;
  marking->long_term_reference_flag = 0;
  marking->adaptive_ref_pic_buffering = 0;
  marking->size = 8;
  marking->rd_cnt = 0;
  marking->wr_cnt = 0;
  return MPP_OK;
}

Assistant:

MPP_RET h264e_marking_init(H264eMarkingInfo *marking)
{
    marking->idr_flag = 0;
    marking->no_output_of_prior_pics = 0;
    marking->long_term_reference_flag = 0;
    marking->adaptive_ref_pic_buffering = 0;
    marking->size = MAX_H264E_MMCO_CNT;
    marking->wr_cnt = 0;
    marking->rd_cnt = 0;

    return MPP_OK;
}